

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

wchar_t prompt_for_easy_filter(equippable_summary *s,_Bool apply_not)

{
  wchar_t wVar1;
  undefined4 uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  int iVar5;
  equippable_expr *peVar6;
  size_t sVar7;
  equippable_expr *peVar8;
  code *pcVar9;
  wchar_t local_68;
  wchar_t ind;
  wchar_t wce [4];
  wchar_t local_50;
  int iStack_4c;
  _Bool search;
  wchar_t k;
  wchar_t j;
  wchar_t wc [4];
  char local_29;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  byte local_25;
  undefined1 auStack_24 [3];
  char ctry [4];
  _Bool threec;
  wchar_t itry;
  char c [4];
  equippable_summary *peStack_18;
  _Bool apply_not_local;
  equippable_summary *s_local;
  
  itry._3_1_ = apply_not;
  peStack_18 = s;
  memset(&threec,0,4);
  _Var3 = get_string("Enter 2 or 3 (for stat) character code and return or return to clear ",&threec
                     ,4);
  if (_Var3) {
    if (threec == false) {
      peStack_18->config_filt_is_on = false;
      wVar1 = (peStack_18->easy_filt).nv;
      wVar4 = get_expected_easy_filter_count(peStack_18->stores);
      if (wVar4 < wVar1) {
        peVar6 = (peStack_18->easy_filt).v + ((peStack_18->easy_filt).nv + L'\xffffffff');
        peVar8 = (peStack_18->easy_filt).v + (peStack_18->easy_filt).nv;
        (peVar6->s).func = (peVar8->s).func;
        uVar2 = *(undefined4 *)&(peVar8->s).field_0xc;
        (peVar6->s).ex = (peVar8->s).ex;
        *(undefined4 *)&(peVar6->s).field_0xc = uVar2;
        uVar2 = *(undefined4 *)&peVar8->field_0x14;
        peVar6->c = peVar8->c;
        *(undefined4 *)&peVar6->field_0x14 = uVar2;
        (peStack_18->easy_filt).nv = (peStack_18->easy_filt).nv + L'\xffffffff';
        filter_items(peStack_18);
        sort_items(peStack_18);
      }
    }
    else {
      local_25 = 0;
      for (_auStack_24 = 0; (_auStack_24 < 4 && (((local_25 & 1) == 0 || (_auStack_24 < 3))));
          _auStack_24 = _auStack_24 + 1) {
        switch(_auStack_24) {
        case 0:
          iVar5 = toupper((int)threec);
          local_29 = (char)iVar5;
          if ((char)itry == '\0') {
            local_28 = 0;
          }
          else {
            iVar5 = tolower((int)(char)itry);
            local_28 = (undefined1)iVar5;
            if (itry._1_1_ == '\0') {
              local_27 = 0;
            }
            else {
              iVar5 = tolower((int)itry._1_1_);
              local_27 = (undefined1)iVar5;
              local_26 = 0;
              local_25 = 1;
            }
          }
          break;
        case 1:
          iVar5 = toupper((int)threec);
          local_29 = (char)iVar5;
          if ((char)itry == '\0') {
            local_28 = 0;
          }
          else {
            iVar5 = toupper((int)(char)itry);
            local_28 = (undefined1)iVar5;
            if (itry._1_1_ == '\0') {
              local_27 = 0;
            }
            else {
              iVar5 = toupper((int)itry._1_1_);
              local_27 = (undefined1)iVar5;
              local_26 = 0;
              local_25 = 1;
            }
          }
          break;
        case 2:
          iVar5 = tolower((int)threec);
          local_29 = (char)iVar5;
          if ((char)itry == '\0') {
            local_28 = 0;
          }
          else {
            iVar5 = tolower((int)(char)itry);
            local_28 = (undefined1)iVar5;
            if (itry._1_1_ == '\0') {
              local_27 = 0;
            }
            else {
              iVar5 = tolower((int)itry._1_1_);
              local_27 = (undefined1)iVar5;
              local_26 = 0;
              local_25 = 1;
            }
          }
          break;
        case 3:
          iVar5 = tolower((int)threec);
          local_29 = (char)iVar5;
          if ((char)itry == '\0') {
            local_28 = 0;
          }
          else {
            iVar5 = toupper((int)(char)itry);
            local_28 = (undefined1)iVar5;
            local_27 = 0;
          }
        }
        sVar7 = text_mbstowcs(&k,&local_29,L'\x04');
        if (sVar7 != 0xffffffffffffffff) {
          iStack_4c = 0;
          local_50 = L'\0';
          wce[3]._3_1_ = 1;
          while ((wce[3]._3_1_ & 1) != 0) {
            if (iStack_4c < 5) {
              if (local_50 < peStack_18->propcats[iStack_4c].n) {
                if ((local_25 & 1) == 0) {
                  if ((k == *peStack_18->propcats[iStack_4c].labels[local_50]) &&
                     (j == peStack_18->propcats[iStack_4c].labels[local_50][1])) {
                    wce[3]._3_1_ = 0;
                  }
                  else {
                    local_50 = local_50 + L'\x01';
                  }
                }
                else {
                  get_ui_entry_label(peStack_18->propcats[iStack_4c].entries[local_50],L'\x04',false
                                     ,&local_68);
                  if (((k == local_68) && (j == ind)) && (wc[0] == wce[0])) {
                    wce[3]._3_1_ = 0;
                  }
                  else {
                    local_50 = local_50 + L'\x01';
                  }
                }
              }
              else {
                local_50 = L'\0';
                iStack_4c = iStack_4c + 1;
              }
            }
            else {
              wce[3]._3_1_ = 0;
            }
          }
          if (iStack_4c < 5) {
            peStack_18->config_filt_is_on = false;
            wVar1 = (peStack_18->easy_filt).nv;
            wVar4 = get_expected_easy_filter_count(peStack_18->stores);
            if (wVar1 == wVar4) {
              (peStack_18->easy_filt).v[(peStack_18->easy_filt).nv].c = EQUIP_EXPR_SELECTOR;
              (peStack_18->easy_filt).nv = (peStack_18->easy_filt).nv + L'\x01';
            }
            iVar5 = (peStack_18->easy_filt).nv + L'\xffffffff';
            (peStack_18->easy_filt).v[iVar5].s.ex.src =
                 peStack_18->propcats[iStack_4c].off + local_50;
            switch(iStack_4c) {
            case 0:
              pcVar9 = sel_at_least_resists;
              if ((itry._3_1_ & 1) != 0) {
                pcVar9 = sel_does_not_resist;
              }
              (peStack_18->easy_filt).v[iVar5].s.func = pcVar9;
              break;
            case 1:
              pcVar9 = sel_has_flag;
              if ((itry._3_1_ & 1) != 0) {
                pcVar9 = sel_does_not_have_flag;
              }
              (peStack_18->easy_filt).v[iVar5].s.func = pcVar9;
              break;
            case 2:
              pcVar9 = sel_does_not_have_flag;
              if ((itry._3_1_ & 1) != 0) {
                pcVar9 = sel_has_flag;
              }
              (peStack_18->easy_filt).v[iVar5].s.func = pcVar9;
              break;
            case 3:
            case 4:
              pcVar9 = sel_has_pos_mod;
              if ((itry._3_1_ & 1) != 0) {
                pcVar9 = sel_has_nonpos_mod;
              }
              (peStack_18->easy_filt).v[iVar5].s.func = pcVar9;
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-equip-cmp.c"
                            ,0x59f,"int prompt_for_easy_filter(struct equippable_summary *, _Bool)")
              ;
            }
            filter_items(peStack_18);
            sort_items(peStack_18);
            return L'\x02';
          }
        }
      }
      peStack_18->dlg_trans_msg = prompt_for_easy_filter::no_matching_attribute_msg;
    }
  }
  return L'\x02';
}

Assistant:

static int prompt_for_easy_filter(struct equippable_summary *s, bool apply_not)
{
	static const char *no_matching_attribute_msg =
		"Did not find attribute with that name; filter unchanged";
	char c[4] = "";
	int itry;
	bool threec;

	if (! get_string("Enter 2 or 3 (for stat) character code and return or return to clear ", c,
		N_ELEMENTS(c))) {
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/* Clear the current filter. */
	if (c[0] == '\0') {
		s->config_filt_is_on = false;
		if (s->easy_filt.nv >
				get_expected_easy_filter_count(s->stores)) {
			s->easy_filt.v[s->easy_filt.nv - 1] =
				s->easy_filt.v[s->easy_filt.nv];
			--s->easy_filt.nv;
			filter_items(s);
			sort_items(s);
		}
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/*
	 * Try different combinations of capitalization to match the
	 * entered string to one of the column labels.
	 */
	itry = 0;
	threec = false;
	while (1) {
		char ctry[4];
		wchar_t wc[4];

		if (itry >= 4 || (threec && itry >= 3)) {
			s->dlg_trans_msg = no_matching_attribute_msg;
			break;
		}
		switch (itry) {
		case 0:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 1:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				if (c[2] != '\0') {
					ctry[2] = toupper(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 2:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 3:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				ctry[2] = '\0';
			} else {
				ctry[1] = '\0';
			}
			break;
		}

		if (text_mbstowcs(wc, ctry, N_ELEMENTS(wc)) != (size_t)-1) {
			int j = 0, k = 0;
			bool search = true;

			while (search) {
				if (j < (int)N_ELEMENTS(s->propcats)) {
					if (k < s->propcats[j].n) {
						if (threec) {
							wchar_t wce[4];

							get_ui_entry_label(s->propcats[j].entries[k], 4, false, wce);
							if (wc[0] == wce[0] &&
							    wc[1] == wce[1] &&
							    wc[2] == wce[2]) {
								search = false;
							} else {
								++k;
							}
						} else if (wc[0] == s->propcats[j].labels[k][0] &&
							wc[1] == s->propcats[j].labels[k][1]) {
							search = false;
						} else {
							++k;
						}
					} else {
						k = 0;
						++j;
					}
				} else {
					search = false;
				}
			}

			/* Configure the new filter and apply it. */
			if (j < (int)N_ELEMENTS(s->propcats)) {
				int ind;

				s->config_filt_is_on = false;
				if (s->easy_filt.nv ==
						get_expected_easy_filter_count(s->stores)) {
					s->easy_filt.v[s->easy_filt.nv].c =
						EQUIP_EXPR_SELECTOR;
					++s->easy_filt.nv;
				}
				ind = s->easy_filt.nv - 1;
				s->easy_filt.v[ind].s.ex.propind =
					s->propcats[j].off + k;
				switch (j) {
				case 0:
					/* Resistance */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_resist :
						sel_at_least_resists;
					break;

				case 1:
					/*
					 * A boolean flag where on is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_have_flag :
						sel_has_flag;
					break;

				case 2:
					/*
					 * A boolean flag where off is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_flag :
						sel_does_not_have_flag;
					break;

				case 3:
				case 4:
					/* Integer modifier. */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_nonpos_mod :
						sel_has_pos_mod;
					break;

				default:
					assert(0);
				}

				filter_items(s);
				sort_items(s);
				break;
			}
		}

		++itry;
	}
	return EQUIP_CMP_MENU_NEW_PAGE;
}